

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * __thiscall Kvm::makeIf(Kvm *this,Value *pred,Value *conseq,Value *alternate)

{
  Value *pVVar1;
  Value *result;
  GcGuard guard;
  Value *local_38;
  GcGuard local_30;
  
  local_38 = (Value *)0x0;
  local_30.gc_ = &this->gc_;
  local_30.times_ = 0;
  GcGuard::pushLocalStackRoot(&local_30,&local_38);
  local_38 = makeCell(this,alternate,this->NIL);
  local_38 = makeCell(this,conseq,local_38);
  local_38 = makeCell(this,pred,local_38);
  pVVar1 = makeCell(this,this->IF,local_38);
  local_38 = pVVar1;
  GcGuard::~GcGuard(&local_30);
  return pVVar1;
}

Assistant:

const Value* Kvm::makeIf(const Value *pred, const Value *conseq, const Value *alternate)
{
    const Value *result = nullptr;
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result);
    result = makeCell(alternate, NIL);
    result = makeCell(conseq, result);
    result = makeCell(pred, result);
    result = makeCell(IF, result);
    return result;
}